

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O2

void anon_unknown.dwarf_26ba73::PulseMainloop::deviceSinkCallbackC
               (pa_context *context,pa_sink_info *info,int eol,void *pdata)

{
  bool bVar1;
  int __val;
  long lVar2;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  _Var3;
  long lVar4;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  __it;
  allocator local_99;
  DevMap *local_98;
  string newname;
  undefined1 local_70 [64];
  
  if (eol != 0) {
    std::condition_variable::notify_all();
    return;
  }
  local_98 = DAT_0022a7c8;
  lVar4 = (long)DAT_0022a7c8 - (long)(anonymous_namespace)::PlaybackDevices;
  __it._M_current = (anonymous_namespace)::PlaybackDevices;
  local_70._0_8_ = info;
  for (lVar2 = lVar4 >> 8; _Var3._M_current = __it._M_current, 0 < lVar2; lVar2 = lVar2 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::PulseMainloop::deviceSinkCallback(pa_context*,pa_sink_info_const*,int)::{lambda((anonymous_namespace)::DevMap_const&)#1}>
            ::operator()((_Iter_pred<(anonymous_namespace)::PulseMainloop::deviceSinkCallback(pa_context*,pa_sink_info_const*,int)::_lambda((anonymous_namespace)::DevMap_const&)_1_>
                          *)local_70,__it);
    if (bVar1) goto LAB_00160ec6;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::PulseMainloop::deviceSinkCallback(pa_context*,pa_sink_info_const*,int)::{lambda((anonymous_namespace)::DevMap_const&)#1}>
            ::operator()((_Iter_pred<(anonymous_namespace)::PulseMainloop::deviceSinkCallback(pa_context*,pa_sink_info_const*,int)::_lambda((anonymous_namespace)::DevMap_const&)_1_>
                          *)local_70,__it._M_current + 1);
    _Var3._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_00160ec6;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::PulseMainloop::deviceSinkCallback(pa_context*,pa_sink_info_const*,int)::{lambda((anonymous_namespace)::DevMap_const&)#1}>
            ::operator()((_Iter_pred<(anonymous_namespace)::PulseMainloop::deviceSinkCallback(pa_context*,pa_sink_info_const*,int)::_lambda((anonymous_namespace)::DevMap_const&)_1_>
                          *)local_70,__it._M_current + 2);
    _Var3._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_00160ec6;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::PulseMainloop::deviceSinkCallback(pa_context*,pa_sink_info_const*,int)::{lambda((anonymous_namespace)::DevMap_const&)#1}>
            ::operator()((_Iter_pred<(anonymous_namespace)::PulseMainloop::deviceSinkCallback(pa_context*,pa_sink_info_const*,int)::_lambda((anonymous_namespace)::DevMap_const&)_1_>
                          *)local_70,__it._M_current + 3);
    _Var3._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_00160ec6;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x100;
  }
  lVar4 = lVar4 >> 6;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var3._M_current = local_98;
      if ((lVar4 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::PulseMainloop::deviceSinkCallback(pa_context*,pa_sink_info_const*,int)::{lambda((anonymous_namespace)::DevMap_const&)#1}>
                  ::operator()((_Iter_pred<(anonymous_namespace)::PulseMainloop::deviceSinkCallback(pa_context*,pa_sink_info_const*,int)::_lambda((anonymous_namespace)::DevMap_const&)_1_>
                                *)local_70,__it), _Var3._M_current = __it._M_current, bVar1))
      goto LAB_00160ec6;
      _Var3._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<(anonymous_namespace)::PulseMainloop::deviceSinkCallback(pa_context*,pa_sink_info_const*,int)::{lambda((anonymous_namespace)::DevMap_const&)#1}>
            ::operator()((_Iter_pred<(anonymous_namespace)::PulseMainloop::deviceSinkCallback(pa_context*,pa_sink_info_const*,int)::_lambda((anonymous_namespace)::DevMap_const&)_1_>
                          *)local_70,_Var3);
    if (bVar1) goto LAB_00160ec6;
    __it._M_current = _Var3._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<(anonymous_namespace)::PulseMainloop::deviceSinkCallback(pa_context*,pa_sink_info_const*,int)::{lambda((anonymous_namespace)::DevMap_const&)#1}>
          ::operator()((_Iter_pred<(anonymous_namespace)::PulseMainloop::deviceSinkCallback(pa_context*,pa_sink_info_const*,int)::_lambda((anonymous_namespace)::DevMap_const&)_1_>
                        *)local_70,__it);
  _Var3._M_current = local_98;
  if (bVar1) {
    _Var3._M_current = __it._M_current;
  }
LAB_00160ec6:
  if (_Var3._M_current == DAT_0022a7c8) {
    std::__cxx11::string::string((string *)&newname,info->description,(allocator *)local_70);
    __val = 2;
    while (bVar1 = checkName((vector<DevMap> *)&(anonymous_namespace)::PlaybackDevices,&newname),
          local_70._8_8_ = newname._M_string_length, bVar1) {
      std::__cxx11::string::assign((char *)&newname);
      std::__cxx11::string::append((char *)&newname);
      std::__cxx11::to_string((string *)local_70,__val);
      std::__cxx11::string::append((string *)&newname);
      std::__cxx11::string::~string((string *)local_70);
      __val = __val + 1;
    }
    local_70._0_8_ = local_70 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)newname._M_dataplus._M_p == &newname.field_2) {
      local_70._24_8_ = newname.field_2._8_8_;
    }
    else {
      local_70._0_8_ = newname._M_dataplus._M_p;
    }
    newname._M_string_length = 0;
    newname.field_2._M_local_buf[0] = '\0';
    newname._M_dataplus._M_p = (pointer)&newname.field_2;
    std::__cxx11::string::string((string *)(local_70 + 0x20),info->name,&local_99);
    std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>::
    emplace_back<(anonymous_namespace)::DevMap>
              ((vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>
                *)&(anonymous_namespace)::PlaybackDevices,(DevMap *)local_70);
    DevMap::~DevMap((DevMap *)local_70);
    if (2 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (II) Got device \"%s\", \"%s\"\n",
              DAT_0022a7c8[-1].name._M_dataplus._M_p,DAT_0022a7c8[-1].device_name._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&newname);
  }
  return;
}

Assistant:

void deviceSinkCallback(pa_context*, const pa_sink_info *info, int eol) noexcept
    {
        if(eol)
        {
            mCondVar.notify_all();
            return;
        }

        /* Skip this device is if it's already in the list. */
        auto match_devname = [info](const DevMap &entry) -> bool
        { return entry.device_name == info->name; };
        if(std::find_if(PlaybackDevices.cbegin(), PlaybackDevices.cend(), match_devname) != PlaybackDevices.cend())
            return;

        /* Make sure the display name (description) is unique. Append a number
         * counter as needed.
         */
        int count{1};
        std::string newname{info->description};
        while(checkName(PlaybackDevices, newname))
        {
            newname = info->description;
            newname += " #";
            newname += std::to_string(++count);
        }
        PlaybackDevices.emplace_back(DevMap{std::move(newname), info->name});
        DevMap &newentry = PlaybackDevices.back();

        TRACE("Got device \"%s\", \"%s\"\n", newentry.name.c_str(), newentry.device_name.c_str());
    }